

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

char * __thiscall
MemoryLeakDetector::reallocateMemoryAndLeakInformation
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,size_t line,bool allocatNodesSeperately)

{
  MemoryLeakDetectorNode MVar1;
  MemLeakPeriod MVar2;
  int iVar3;
  void *pvVar4;
  undefined4 extraout_var;
  MemoryLeakDetectorNode *pMVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  
  uVar8 = size + 3 & 0xfffffffffffffff8;
  pvVar4 = (*PlatformSpecificRealloc)(memory,uVar8 + (ulong)!allocatNodesSeperately * 0x40 + 8);
  if (pvVar4 == (void *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    if (allocatNodesSeperately) {
      iVar3 = (*allocator->_vptr_TestMemoryAllocator[8])(allocator,0x40);
      pMVar5 = (MemoryLeakDetectorNode *)CONCAT44(extraout_var,iVar3);
    }
    else {
      pMVar5 = (MemoryLeakDetectorNode *)((long)pvVar4 + uVar8 + 8);
    }
    uVar6 = this->allocationSequenceNumber_;
    this->allocationSequenceNumber_ = uVar6 + 1;
    MVar2 = this->current_period_;
    MVar1 = (MemoryLeakDetectorNode)this->current_allocation_stage_;
    *(uint *)(pMVar5 + 8) = uVar6;
    *(void **)(pMVar5 + 0x10) = pvVar4;
    *(size_t *)pMVar5 = size;
    *(TestMemoryAllocator **)(pMVar5 + 0x28) = allocator;
    *(MemLeakPeriod *)(pMVar5 + 0x30) = MVar2;
    pMVar5[0x34] = MVar1;
    *(char **)(pMVar5 + 0x18) = file;
    *(size_t *)(pMVar5 + 0x20) = line;
    *(undefined1 *)((long)pvVar4 + size + 2) = 0x53;
    *(undefined2 *)((long)pvVar4 + size) = 0x4142;
    pcVar7 = *(char **)(pMVar5 + 0x10);
    uVar6 = (int)pcVar7 + (int)((ulong)pcVar7 / 0x49) * -0x49;
    *(MemoryLeakDetectorNode **)(pMVar5 + 0x38) = (this->memoryTable_).table_[uVar6].head_;
    (this->memoryTable_).table_[uVar6].head_ = pMVar5;
  }
  return pcVar7;
}

Assistant:

char* MemoryLeakDetector::reallocateMemoryAndLeakInformation(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
    char* new_memory = reallocateMemoryWithAccountingInformation(allocator, memory, size, file, line, allocatNodesSeperately);
    if (new_memory == NULLPTR) return NULLPTR;

    MemoryLeakDetectorNode *node = createMemoryLeakAccountingInformation(allocator, size, new_memory, allocatNodesSeperately);
    storeLeakInformation(node, new_memory, size, allocator, file, line);
    return node->memory_;
}